

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptArrays.cpp
# Opt level: O1

void __thiscall GlobOpt::ArraySrcOpt::ShareBailOut(ArraySrcOpt *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BailOutInfo *pBVar4;
  Instr *this_00;
  
  if (this->shareableBailOutInfo == (BailOutInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                       ,0x635,"(shareableBailOutInfo)","shareableBailOutInfo");
    if (!bVar2) goto LAB_00487d1f;
    *puVar3 = 0;
  }
  if (this->shareableBailOutInfo->bailOutInstr == this->shareableBailOutInfoOriginalOwner) {
    pBVar4 = IR::Instr::GetBailOutInfo(this->shareableBailOutInfoOriginalOwner);
    if (pBVar4 != this->shareableBailOutInfo) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x63b,
                         "(shareableBailOutInfoOriginalOwner->GetBailOutInfo() == shareableBailOutInfo)"
                         ,
                         "shareableBailOutInfoOriginalOwner->GetBailOutInfo() == shareableBailOutInfo"
                        );
      if (!bVar2) goto LAB_00487d1f;
      *puVar3 = 0;
    }
    this_00 = IR::Instr::ShareBailOut(this->shareableBailOutInfoOriginalOwner);
    pBVar4 = IR::Instr::GetBailOutInfo(this_00);
    if (pBVar4 != this->shareableBailOutInfo) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptArrays.cpp"
                         ,0x63d,"(sharedBailOut->GetBailOutInfo() == shareableBailOutInfo)",
                         "sharedBailOut->GetBailOutInfo() == shareableBailOutInfo");
      if (!bVar2) {
LAB_00487d1f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    this->shareableBailOutInfoOriginalOwner = (Instr *)0x0;
    IR::Instr::Unlink(this_00);
    IR::Instr::InsertBefore(this->insertBeforeInstr,this_00);
    this->insertBeforeInstr = this_00;
  }
  return;
}

Assistant:

void GlobOpt::ArraySrcOpt::ShareBailOut()
{
    Assert(shareableBailOutInfo);
    if (shareableBailOutInfo->bailOutInstr != shareableBailOutInfoOriginalOwner)
    {
        return;
    }

    Assert(shareableBailOutInfoOriginalOwner->GetBailOutInfo() == shareableBailOutInfo);
    IR::Instr *const sharedBailOut = shareableBailOutInfoOriginalOwner->ShareBailOut();
    Assert(sharedBailOut->GetBailOutInfo() == shareableBailOutInfo);
    shareableBailOutInfoOriginalOwner = nullptr;
    sharedBailOut->Unlink();
    insertBeforeInstr->InsertBefore(sharedBailOut);
    insertBeforeInstr = sharedBailOut;
}